

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_compile_feature_iffeatures(lysp_module *pmod)

{
  long lVar1;
  LY_ERR LVar2;
  lysp_feature *local_b8;
  ulong local_a8;
  ulong local_98;
  long local_88;
  long local_78;
  long local_70;
  undefined8 *local_58;
  char *p___1;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  undefined8 *puStack_38;
  uint32_t idx;
  lysp_feature **df;
  lysp_feature *f;
  uint64_t v;
  uint64_t u;
  lysp_module *pmod_local;
  
  df = (lysp_feature **)0x0;
  p__._4_4_ = 0;
  u = (uint64_t)pmod;
  do {
    do {
      df = (lysp_feature **)
           lysp_feature_next((lysp_feature *)df,(lysp_module *)u,(uint32_t *)((long)&p__ + 4));
      if ((lysp_feature *)df == (lysp_feature *)0x0) {
        return LY_SUCCESS;
      }
    } while (((lysp_feature *)df)->iffeatures == (lysp_qname *)0x0);
    if (((lysp_feature *)df)->iffeatures_c == (lysc_iffeature *)0x0) {
      if (((lysp_feature *)df)->iffeatures == (lysp_qname *)0x0) {
        local_78 = 0;
      }
      else {
        local_78 = *(long *)&((lysp_feature *)df)->iffeatures[-1].flags;
      }
      _ret___1 = (long *)calloc(1,local_78 * 0x10 + 8);
      if (_ret___1 == (long *)0x0) {
        ly_log((ly_ctx *)**(undefined8 **)u,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_feature_iffeatures");
        return LY_EMEM;
      }
    }
    else {
      if (((lysp_feature *)df)->iffeatures == (lysp_qname *)0x0) {
        local_70 = 0;
      }
      else {
        local_70 = *(long *)&((lysp_feature *)df)->iffeatures[-1].flags;
      }
      _ret___1 = (long *)realloc(&((lysp_feature *)df)->iffeatures_c[-1].features,
                                 ((long)((lysp_feature *)df)->iffeatures_c[-1].features + local_70)
                                 * 0x10 + 8);
      if (_ret___1 == (long *)0x0) {
        ly_log((ly_ctx *)**(undefined8 **)u,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_feature_iffeatures");
        return LY_EMEM;
      }
    }
    df[2] = (lysp_feature *)(_ret___1 + 1);
    if (df[2] != (lysp_feature *)0x0) {
      if (df[1] == (lysp_feature *)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = *(long *)&df[1][-1].flags;
      }
      memset(&df[2]->name + *_ret___1 * 2,0,local_88 << 4);
    }
    v = 0;
    while( true ) {
      if (df[1] == (lysp_feature *)0x0) {
        local_98 = 0;
      }
      else {
        local_98 = *(ulong *)&df[1][-1].flags;
      }
      if (local_98 <= v) break;
      *(long *)&df[2][-1].flags = *(long *)&df[2][-1].flags + 1;
      LVar2 = lys_compile_iffeature
                        ((ly_ctx *)**(undefined8 **)u,(lysp_qname *)(&df[1]->name + v * 3),
                         (lysc_iffeature *)(&df[2]->name + v * 2));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      v = v + 1;
    }
    v = 0;
    while( true ) {
      if (df[2] == (lysp_feature *)0x0) {
        local_a8 = 0;
      }
      else {
        local_a8 = *(ulong *)&df[2][-1].flags;
      }
      if (local_a8 <= v) break;
      f = (lysp_feature *)0x0;
      while( true ) {
        if ((&df[2]->iffeatures)[v * 2] == (lysp_qname *)0x0) {
          local_b8 = (lysp_feature *)0x0;
        }
        else {
          local_b8 = *(lysp_feature **)&(&df[2]->iffeatures)[v * 2][-1].flags;
        }
        if (local_b8 <= f) break;
        if (df == (lysp_feature **)(&(&df[2]->iffeatures)[v * 2]->str)[(long)f]) {
          ly_vlog((ly_ctx *)**(undefined8 **)u,(char *)0x0,LYVE_REFERENCE,
                  "Feature \"%s\" is referenced from itself.",*df);
          return LY_EVALID;
        }
        LVar2 = lys_compile_feature_circular_check
                          ((ly_ctx *)**(undefined8 **)u,
                           (lysp_feature *)(&(&df[2]->iffeatures)[v * 2]->str)[(long)f],
                           (lysp_feature **)df[3]);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        if (*(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18) == 0) {
          local_58 = (undefined8 *)malloc(0x10);
          if (local_58 == (undefined8 *)0x0) {
            ly_log((ly_ctx *)**(undefined8 **)u,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_compile_feature_iffeatures");
            return LY_EMEM;
          }
          *local_58 = 1;
        }
        else {
          lVar1 = *(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18);
          *(long *)(lVar1 + -8) = *(long *)(lVar1 + -8) + 1;
          local_58 = (undefined8 *)
                     realloc((void *)(*(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18)
                                     + -8),
                             *(long *)(*(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18
                                                ) + -8) * 8 + 8);
          if (local_58 == (undefined8 *)0x0) {
            lVar1 = *(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18);
            *(long *)(lVar1 + -8) = *(long *)(lVar1 + -8) + -1;
            ly_log((ly_ctx *)**(undefined8 **)u,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_compile_feature_iffeatures");
            return LY_EMEM;
          }
        }
        *(undefined8 **)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18) = local_58 + 1;
        puStack_38 = (undefined8 *)
                     (*(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18) +
                     (*(long *)(*(long *)((&(&df[2]->iffeatures)[v * 2]->str)[(long)f] + 0x18) + -8)
                     + -1) * 8);
        memset(puStack_38,0,8);
        *puStack_38 = df;
        f = (lysp_feature *)((long)&f->name + 1);
      }
      v = v + 1;
    }
  } while( true );
}

Assistant:

LY_ERR
lys_compile_feature_iffeatures(struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_feature *f = NULL, **df;
    uint32_t idx = 0;

    while ((f = lysp_feature_next(f, pmod, &idx))) {
        if (!f->iffeatures) {
            continue;
        }

        /* compile if-features */
        LY_ARRAY_CREATE_RET(pmod->mod->ctx, f->iffeatures_c, LY_ARRAY_COUNT(f->iffeatures), LY_EMEM);
        LY_ARRAY_FOR(f->iffeatures, u) {
            LY_ARRAY_INCREMENT(f->iffeatures_c);
            LY_CHECK_RET(lys_compile_iffeature(pmod->mod->ctx, &(f->iffeatures)[u], &(f->iffeatures_c)[u]));
        }
        LY_ARRAY_FOR(f->iffeatures_c, u) {
            LY_ARRAY_FOR(f->iffeatures_c[u].features, v) {
                /* check for circular dependency - direct reference first,... */
                if (f == f->iffeatures_c[u].features[v]) {
                    LOGVAL(pmod->mod->ctx, LYVE_REFERENCE, "Feature \"%s\" is referenced from itself.", f->name);
                    return LY_EVALID;
                }
                /* ... and indirect circular reference */
                LY_CHECK_RET(lys_compile_feature_circular_check(pmod->mod->ctx, f->iffeatures_c[u].features[v], f->depfeatures));

                /* add itself into the dependants list */
                LY_ARRAY_NEW_RET(pmod->mod->ctx, f->iffeatures_c[u].features[v]->depfeatures, df, LY_EMEM);
                *df = f;
            }
        }
    }

    return LY_SUCCESS;
}